

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uint __thiscall
math::wide_integer::uintwide_t<32768u,unsigned_int,void,false>::
extract_builtin_integral_type<unsigned_int,void>(uintwide_t<32768u,unsigned_int,void,false> *this)

{
  const_iterator puVar1;
  size_type local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  unsigned_long ilim;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  local_20 = 1;
  ilim = (unsigned_long)this;
  local_28 = detail::array_detail::array<unsigned_int,_1024UL>::size();
  local_18 = detail::min_unsafe<unsigned_long>(&local_20,&local_28);
  puVar1 = detail::array_detail::array<unsigned_int,_1024UL>::cbegin
                     ((array<unsigned_int,_1024UL> *)this);
  return *puVar1;
}

Assistant:

WIDE_INTEGER_NODISCARD constexpr auto extract_builtin_integral_type() const -> UnknownBuiltInIntegralType
    {
      using local_unknown_integral_type = UnknownBuiltInIntegralType;
      using digits_ratio_type           = digits_ratio<local_unknown_integral_type>;

      const auto ilim = (detail::min_unsafe)(static_cast<unsigned_fast_type>(digits_ratio_type::value),
                                   static_cast<unsigned_fast_type>(values.size()));

      // Handle cases for which the input parameter is less wide
      // or equally as wide as the limb width or wider than the limb width.
      return ((digits_ratio_type::value < static_cast<unsigned_fast_type>(UINT8_C(2)))
               ? static_cast<local_unknown_integral_type>(*values.cbegin())
               : digits_ratio_type::extract(values.cbegin(), ilim));
    }